

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

int ndiGetGXMarkerInfo(ndicapi *pol,int port,int marker)

{
  char cVar1;
  char (*pacVar2) [12];
  int iVar3;
  int iVar4;
  
  iVar4 = 0;
  if (0xffffffeb < marker - 0x55U) {
    if (port - 0x31U < 3) {
      pacVar2 = pol->GxInformation + (port - 0x31U);
    }
    else {
      if (8 < port - 0x41U) {
        return 0;
      }
      pacVar2 = pol->GxPassiveInformation + (port - 0x41U);
    }
    cVar1 = *(char *)((long)pacVar2 + (0x4c - (long)marker));
    iVar3 = -0x57;
    if ((((byte)(cVar1 + 0x9fU) < 6) || (iVar3 = -0x37, (byte)(cVar1 + 0xbfU) < 6)) ||
       (iVar3 = -0x30, iVar4 = 0, (byte)(cVar1 - 0x30U) < 10)) {
      iVar4 = iVar3 + cVar1;
    }
  }
  return iVar4;
}

Assistant:

ndicapiExport int ndiGetGXMarkerInfo(ndicapi* pol, int port, int marker)
{
  char* dp;

  if (marker < 'A' || marker > 'T')
  {
    return 0;
  }

  if (port >= '1' && port <= '3')
  {
    dp = pol->GxInformation[port - '1'];
  }
  else if (port >= 'A' && port <= 'I')
  {
    dp = pol->GxPassiveInformation[port - 'A'];
  }
  else
  {
    return 0;
  }
  dp += 11 - (marker - 'A');

  return (int)ndiHexToUnsignedLong(dp, 1);
}